

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O3

Vec_Str_t * Saig_SynchSequence(Aig_Man_t *pAig,int nWords)

{
  Vec_Ptr_t *pVVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Vec_Ptr_t *vSequence;
  void **ppvVar5;
  Vec_Ptr_t *vSimInfo;
  int iVar6;
  void **ppvVar7;
  long lVar8;
  int iVar9;
  int iPatBest;
  int local_44;
  Vec_Ptr_t *local_40;
  void **local_38;
  
  if (pAig->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                  ,0x19c,"Vec_Str_t *Saig_SynchSequence(Aig_Man_t *, int)");
  }
  Aig_ManRandom(1);
  iVar9 = pAig->nRegs;
  vSequence = (Vec_Ptr_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar9 * 0x14 - 1U) {
    iVar6 = iVar9 * 0x14;
  }
  vSequence->nSize = 0;
  vSequence->nCap = iVar6;
  if (iVar6 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar6);
  }
  vSequence->pArray = ppvVar5;
  iVar9 = pAig->vObjs->nSize;
  lVar8 = (long)iVar9;
  local_38 = (void **)malloc(((long)nWords * 4 + 8) * lVar8);
  if (0 < lVar8) {
    ppvVar5 = local_38 + lVar8;
    ppvVar7 = local_38;
    do {
      *ppvVar7 = ppvVar5;
      ppvVar7 = ppvVar7 + 1;
      ppvVar5 = (void **)((long)ppvVar5 + (long)nWords * 4);
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  vSimInfo = (Vec_Ptr_t *)malloc(0x10);
  vSimInfo->nSize = iVar9;
  vSimInfo->nCap = iVar9;
  vSimInfo->pArray = local_38;
  Saig_SynchSetConstant1(pAig,vSimInfo,nWords);
  uVar3 = pAig->nRegs;
  Saig_SynchInitRegsTernary(pAig,vSimInfo,nWords);
  if (0 < (int)uVar3) {
    uVar4 = 0;
    local_40 = vSequence;
    do {
      iVar9 = 100;
      while( true ) {
        Saig_SynchInitPisRandom(pAig,vSimInfo,nWords);
        Saig_SynchTernarySimulate(pAig,vSimInfo,nWords);
        uVar2 = Saig_SynchCountX(pAig,vSimInfo,nWords,&local_44);
        pVVar1 = local_40;
        if ((int)uVar2 < (int)uVar3) break;
        iVar9 = iVar9 + -1;
        if (iVar9 == 0) goto LAB_006f8b1a;
      }
      uVar3 = Saig_SynchSavePattern(pAig,vSimInfo,nWords,local_44,(Vec_Str_t *)local_40);
      if (uVar2 != uVar3) {
        __assert_fail("nTerCur == nTerCur2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                      ,0x1b4,"Vec_Str_t *Saig_SynchSequence(Aig_Man_t *, int)");
      }
      uVar3 = uVar2;
    } while ((uVar4 < 99) && (uVar4 = uVar4 + 1, 0 < (int)uVar2));
    vSequence = pVVar1;
    if (0 < (int)uVar2) {
LAB_006f8b1a:
      printf("Count not initialize %d registers.\n",(ulong)uVar3);
      if (local_38 != (void **)0x0) {
        free(local_38);
      }
      free(vSimInfo);
      vSequence = (Vec_Ptr_t *)0x0;
      ppvVar5 = pVVar1->pArray;
      vSimInfo = pVVar1;
      goto LAB_006f8b51;
    }
  }
  iVar9 = Saig_SynchSequenceRun(pAig,vSimInfo,(Vec_Str_t *)vSequence,1);
  if (iVar9 != 0) {
    __assert_fail("RetValue == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                  ,0x1c2,"Vec_Str_t *Saig_SynchSequence(Aig_Man_t *, int)");
  }
  Aig_ManCleanMarkA(pAig);
  ppvVar5 = local_38;
LAB_006f8b51:
  if (ppvVar5 != (void **)0x0) {
    free(ppvVar5);
  }
  free(vSimInfo);
  return (Vec_Str_t *)vSequence;
}

Assistant:

Vec_Str_t * Saig_SynchSequence( Aig_Man_t * pAig, int nWords )
{
    int nStepsMax = 100;  // the maximum number of simulation steps
    int nTriesMax = 100;  // the maximum number of attempts at each step
    int fVerify   =   1;  // verify the resulting pattern
    Vec_Str_t * vSequence;
    Vec_Ptr_t * vSimInfo;
    int nTerPrev, nTerCur = 0, nTerCur2;
    int iPatBest, RetValue, s, t;
    assert( Saig_ManRegNum(pAig) > 0 );
    // reset random numbers
    Aig_ManRandom( 1 );
    // start the sequence
    vSequence = Vec_StrAlloc( 20 * Saig_ManRegNum(pAig) );
    // create sim info and init registers
    vSimInfo = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(pAig), nWords );
    Saig_SynchSetConstant1( pAig, vSimInfo, nWords );
    // iterate over the timeframes
    nTerPrev = Saig_ManRegNum(pAig);
    Saig_SynchInitRegsTernary( pAig, vSimInfo, nWords );
    for ( s = 0; s < nStepsMax && nTerPrev > 0; s++ )
    {
        for ( t = 0; t < nTriesMax; t++ )
        {
            Saig_SynchInitPisRandom( pAig, vSimInfo, nWords );
            Saig_SynchTernarySimulate( pAig, vSimInfo, nWords );
            nTerCur = Saig_SynchCountX( pAig, vSimInfo, nWords, &iPatBest );
            if ( nTerCur < nTerPrev )
                break;
        }
        if ( t == nTriesMax )
            break;
        nTerCur2 = Saig_SynchSavePattern( pAig, vSimInfo, nWords, iPatBest, vSequence );
        assert( nTerCur == nTerCur2 );
        nTerPrev = nTerCur;
    }
    if ( nTerPrev > 0 )
    {
        printf( "Count not initialize %d registers.\n", nTerPrev );
        Vec_PtrFree( vSimInfo );
        Vec_StrFree( vSequence );
        return NULL;
    }
    // verify that the sequence is correct
    if ( fVerify )
    {
        RetValue = Saig_SynchSequenceRun( pAig, vSimInfo, vSequence, 1 );
        assert( RetValue == 0 );
        Aig_ManCleanMarkA( pAig );
    }
    Vec_PtrFree( vSimInfo );
    return vSequence;
}